

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

bool __thiscall
cmComputeTargetDepends::CheckComponents(cmComputeTargetDepends *this,cmComputeComponentGraph *ccg)

{
  pointer pcVar1;
  int iVar2;
  TargetType TVar3;
  ulong uVar4;
  ulong uVar5;
  const_iterator ni;
  int *piVar6;
  
  uVar4 = ((long)(ccg->Components).
                 super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(ccg->Components).
                super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x18;
  uVar5 = 0;
  iVar2 = (int)uVar4;
  uVar4 = uVar4 & 0xffffffff;
  if (iVar2 < 1) {
    uVar4 = uVar5;
  }
  do {
    if (uVar5 == uVar4) {
LAB_0041683b:
      return (long)iVar2 <= (long)uVar5;
    }
    pcVar1 = (ccg->Components).super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar6 = *(int **)&pcVar1[uVar5].super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl;
    if (4 < (ulong)((long)*(pointer *)
                           ((long)&pcVar1[uVar5].super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
                   (long)piVar6)) {
      if (this->NoCycles != false) {
LAB_0041682b:
        ComplainAboutBadComponent(this,ccg,(int)uVar5,false);
        goto LAB_0041683b;
      }
      while (piVar6 != *(pointer *)
                        ((long)&pcVar1[uVar5].super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)) {
        TVar3 = cmGeneratorTarget::GetType
                          ((this->Targets).
                           super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[*piVar6]);
        piVar6 = piVar6 + 1;
        if (TVar3 != STATIC_LIBRARY) goto LAB_0041682b;
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool cmComputeTargetDepends::CheckComponents(
  cmComputeComponentGraph const& ccg)
{
  // All non-trivial components should consist only of static
  // libraries.
  std::vector<NodeList> const& components = ccg.GetComponents();
  int nc = static_cast<int>(components.size());
  for (int c = 0; c < nc; ++c) {
    // Get the current component.
    NodeList const& nl = components[c];

    // Skip trivial components.
    if (nl.size() < 2) {
      continue;
    }

    // Immediately complain if no cycles are allowed at all.
    if (this->NoCycles) {
      this->ComplainAboutBadComponent(ccg, c);
      return false;
    }

    // Make sure the component is all STATIC_LIBRARY targets.
    for (NodeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni) {
      if (this->Targets[*ni]->GetType() != cmStateEnums::STATIC_LIBRARY) {
        this->ComplainAboutBadComponent(ccg, c);
        return false;
      }
    }
  }
  return true;
}